

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::LogParser::EndElement(LogParser *this)

{
  string *in_RSI;
  
  EndElement((LogParser *)&this[-1].CurChange,in_RSI);
  return;
}

Assistant:

virtual void EndElement(const std::string& name)
    {
    if(name == "logentry")
      {
      this->SVN->DoRevisionSVN(this->Rev, this->Changes);
      }
    else if(!this->CData.empty() && name == "path")
      {
      std::string orig_path(&this->CData[0], this->CData.size());
      std::string new_path = SVNRepo.BuildLocalPath( orig_path );
      this->CurChange.Path.assign(new_path);
      this->Changes.push_back(this->CurChange);
      }
    else if(!this->CData.empty() && name == "author")
      {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "date")
      {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "msg")
      {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
      }
    this->CData.clear();
    }